

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O0

void __thiscall opengv::absolute_pose::modules::Epnp::solve_for_sign(Epnp *this)

{
  int i_1;
  int j;
  int i;
  Epnp *this_local;
  
  if (((this->pcs[2] < 0.0) && (0 < *this->signs)) || ((0.0 < this->pcs[2] && (*this->signs < 0))))
  {
    for (i = 0; i < 4; i = i + 1) {
      for (j = 0; j < 3; j = j + 1) {
        this->ccs[i][j] = -this->ccs[i][j];
      }
    }
    for (i_1 = 0; i_1 < this->number_of_correspondences; i_1 = i_1 + 1) {
      this->pcs[i_1 * 3] = -this->pcs[i_1 * 3];
      this->pcs[i_1 * 3 + 1] = -this->pcs[i_1 * 3 + 1];
      this->pcs[i_1 * 3 + 2] = -this->pcs[i_1 * 3 + 2];
    }
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::solve_for_sign(void)
{
  //change2: the following method is not independent of the optical system
  /*if (pcs[2] < 0.0) {
    for(int i = 0; i < 4; i++)
      for(int j = 0; j < 3; j++)
  ccs[i][j] = -ccs[i][j];

    for(int i = 0; i < number_of_correspondences; i++) {
      pcs[3 * i    ] = -pcs[3 * i];
      pcs[3 * i + 1] = -pcs[3 * i + 1];
      pcs[3 * i + 2] = -pcs[3 * i + 2];
    }
  }*/

  //change to this (using original depths)
  if( (pcs[2] < 0.0 && signs[0] > 0) || (pcs[2] > 0.0 && signs[0] < 0) )
  {
    for(int i = 0; i < 4; i++)
      for(int j = 0; j < 3; j++)
        ccs[i][j] = -ccs[i][j];

    for(int i = 0; i < number_of_correspondences; i++)
    {
      pcs[3 * i    ] = -pcs[3 * i];
      pcs[3 * i + 1] = -pcs[3 * i + 1];
      pcs[3 * i + 2] = -pcs[3 * i + 2];
    }
  }
}